

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_basic_render
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uint *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  code *pcVar5;
  long *plVar6;
  LayoutBindingTestResult *pLVar7;
  allocator<char> local_34f;
  allocator<char> local_34e;
  allocator<char> local_34d;
  uint local_34c;
  LayoutBindingTestResult drawTestResult;
  String decl;
  vector<int,_std::allocator<int>_> bindings;
  String local_2c8;
  String local_2a8;
  string local_288 [32];
  String local_268;
  String local_248;
  string local_228 [32];
  String local_208;
  string local_1e8 [32];
  String local_1c8;
  StringStream s;
  undefined4 extraout_var_01;
  
  StringStream::StringStream(&s);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&decl,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
            (&drawTestResult,this,&decl);
  poVar3 = std::operator<<((ostream *)&s,(string *)&drawTestResult);
  std::operator<<(poVar3,";\n");
  std::__cxx11::string::~string((string *)&drawTestResult);
  std::__cxx11::string::~string((string *)&decl);
  std::__cxx11::stringbuf::str();
  setTemplateParam(this,"UNIFORM_ACCESS",(String *)&drawTestResult);
  std::__cxx11::string::~string((string *)&drawTestResult);
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar2,0);
  puVar4 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  do {
    if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish <= puVar4) {
      drawTestResult._0_8_ = &drawTestResult.m_reason._M_string_length;
      drawTestResult.m_reason._M_dataplus._M_p = (pointer)0x0;
      drawTestResult.m_reason._M_string_length._0_1_ = 0;
      __return_storage_ptr__->m_passed = true;
      __return_storage_ptr__->m_notRunForThisContext = false;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->m_reason,(string *)&drawTestResult);
      pLVar7 = &drawTestResult;
LAB_00be3b81:
      std::__cxx11::string::~string((string *)pLVar7);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&bindings.super__Vector_base<int,_std::allocator<int>_>);
      StringStream::~StringStream(&s);
      return __return_storage_ptr__;
    }
    local_34c = *puVar4;
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&drawTestResult,*(char **)CONCAT44(extraout_var,iVar2),&local_34d);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
              (&local_2a8,this,(ulong)local_34c);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,*(char **)(CONCAT44(extraout_var_00,iVar2) + 0x18),&local_34e);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_1e8,this,0);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
              (&local_1c8,this,local_1e8);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_288,this,0);
    std::__cxx11::string::string<std::allocator<char>>(local_228,"float",&local_34f);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
              (&local_208,this,local_288,local_228);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&local_248,this,0);
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    local_2c8._M_string_length = 0;
    local_2c8.field_2._M_local_buf[0] = '\0';
    buildUniformDecl(&decl,this,(String *)&drawTestResult,&local_2a8,&local_268,&local_1c8,
                     &local_208,&local_248,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&drawTestResult);
    setTemplateParam(this,"UNIFORM_DECL",&decl);
    updateTemplate(this);
    iVar2 = (*(this->super_IProgramContextSupplier)._vptr_IProgramContextSupplier[6])();
    this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar2);
    bVar1 = LayoutBindingProgram::compiledAndLinked(this_00);
    if (!bVar1) {
      LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&drawTestResult,this_00,false);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->m_reason,(string *)&drawTestResult);
      pLVar7 = &drawTestResult;
LAB_00be3b6e:
      std::__cxx11::string::~string((string *)pLVar7);
      (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
      pLVar7 = (LayoutBindingTestResult *)&decl;
      goto LAB_00be3b81;
    }
    pcVar5 = (code *)this->m_drawTest;
    plVar6 = (long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                     *(long *)&this->field_0x88);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
    }
    (*pcVar5)(&drawTestResult,plVar6,(this_00->m_program->m_program).m_program);
    if (drawTestResult.m_passed == false) {
      std::__cxx11::string::string((string *)&local_2a8,(string *)&drawTestResult.m_reason);
      LayoutBindingTestResult::LayoutBindingTestResult
                (__return_storage_ptr__,false,&local_2a8,false);
      std::__cxx11::string::~string((string *)&local_2a8);
      pLVar7 = (LayoutBindingTestResult *)&drawTestResult.m_reason;
      goto LAB_00be3b6e;
    }
    std::__cxx11::string::~string((string *)&drawTestResult.m_reason);
    (*this_00->_vptr_LayoutBindingProgram[1])(this_00);
    std::__cxx11::string::~string((string *)&decl);
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_basic_render()
{
	bool passed = true;

	StringStream s;
	s << buildAccess(getDefaultUniformName()) << ";\n";
	setTemplateParam("UNIFORM_ACCESS", s.str());

	std::vector<int> bindings = makeSparseRange(maxBindings());
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int	binding = *it;
		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(binding),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), String());
		setTemplateParam("UNIFORM_DECL", decl);
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}

		LayoutBindingTestResult drawTestResult = ((*this).*(m_drawTest))(program->getProgram(), binding);
		if (!drawTestResult.testPassed())
		{
			return LayoutBindingTestResult(drawTestResult.testPassed(), drawTestResult.getReason());
		}
	}
	return true;
}